

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

int socketsys::UnixProvider::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int extraout_EAX;
  SocketBindException *this;
  int *piVar2;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar3;
  addrinfo *res;
  socklen_t length;
  int type;
  socklen_t size;
  array<char,_6UL> portBuffer;
  sockaddr data;
  addrinfo *local_98;
  socklen_t local_8c;
  int local_88 [2];
  char local_80 [8];
  sockaddr local_78;
  addrinfo local_68;
  
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[0] = '\0';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  sprintf(local_80,"%d",CONCAT44(in_register_00000014,__len));
  local_78.sa_family = 0;
  local_78.sa_data[0] = '\0';
  local_78.sa_data[1] = '\0';
  local_78.sa_data[2] = '\0';
  local_78.sa_data[3] = '\0';
  local_78.sa_data[4] = '\0';
  local_78.sa_data[5] = '\0';
  local_78.sa_data[6] = '\0';
  local_78.sa_data[7] = '\0';
  local_78.sa_data[8] = '\0';
  local_78.sa_data[9] = '\0';
  local_78.sa_data[10] = '\0';
  local_78.sa_data[0xb] = '\0';
  local_78.sa_data[0xc] = '\0';
  local_78.sa_data[0xd] = '\0';
  local_88[1] = 0x10;
  getsockname(__fd,&local_78,(socklen_t *)(local_88 + 1));
  local_8c = 4;
  getsockopt(__fd,1,3,local_88,&local_8c);
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68._0_8_ = (local_78._0_8_ & 0xffff) << 0x20;
  local_68.ai_protocol = 0x11;
  if (local_88[0] == 1) {
    local_68.ai_protocol = 6;
  }
  local_68.ai_socktype = local_88[0];
  iVar1 = getaddrinfo(*(char **)(__addr->sa_data + 6),local_80,&local_68,&local_98);
  if (iVar1 == 0) {
    iVar1 = ::connect(__fd,local_98->ai_addr,local_98->ai_addrlen);
    freeaddrinfo(local_98);
    if (iVar1 != -1) {
      return extraout_EAX;
    }
    this = (SocketBindException *)__cxa_allocate_exception(0x10);
    piVar2 = __errno_location();
    SocketBindException::SocketBindException(this,"Linux failed to connect socket ",*piVar2);
    ppuVar3 = &SocketBindException::typeinfo;
  }
  else {
    this = (SocketBindException *)__cxa_allocate_exception(0x10);
    NameResolveException::NameResolveException
              ((NameResolveException *)this,"Linux failed to resolve address ",iVar1);
    ppuVar3 = &NameResolveException::typeinfo;
  }
  __cxa_throw(this,ppuVar3,std::runtime_error::~runtime_error);
}

Assistant:

void UnixProvider::connect(SocketHandle handle, const std::string_view& address, uint16_t port) {
    std::array<char, 6> portBuffer{};
    sprintf(portBuffer.data(), "%d", port);

    sockaddr data{};
    socklen_t size = sizeof(sockaddr);
    getsockname(handle, &data, &size);

    int type;
    socklen_t length = sizeof(int);
    getsockopt(handle, SOL_SOCKET, SO_TYPE, &type, &length);

    addrinfo hints {
            {},
            data.sa_family,
            type,
            type == SOCK_STREAM ? IPPROTO_TCP : IPPROTO_UDP,
    };

    addrinfo* res;
    auto result = getaddrinfo(address.data(), portBuffer.data(), &hints, &res);
    if (result != 0) {
        throw NameResolveException("Linux failed to resolve address ", result);
    }

    result = ::connect(handle, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);

    if (result == -1) {
        throw SocketBindException("Linux failed to connect socket ", errno);
    }
}